

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixture.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
celero::TestFixture::getUserDefinedMeasurementNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,TestFixture *this)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_68;
  shared_ptr<celero::UserDefinedMeasurement> *udm;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  *__range2;
  undefined1 local_38 [8];
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  udms;
  TestFixture *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  
  udms.
  super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  (*this->_vptr_TestFixture[9])(local_38);
  bVar1 = std::
          vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
          ::empty((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                   *)local_38);
  if (!bVar1) {
    __end2 = std::
             vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
             ::begin((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                      *)local_38);
    udm = (shared_ptr<celero::UserDefinedMeasurement> *)
          std::
          vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
          ::end((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                 *)local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<celero::UserDefinedMeasurement>_*,_std::vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
                                       *)&udm), bVar1) {
      local_68 = (__shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<celero::UserDefinedMeasurement>_*,_std::vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
                    ::operator*(&__end2);
      peVar2 = std::
               __shared_ptr_access<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_68);
      (**(code **)(*(long *)peVar2 + 0x18))(&local_88);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<celero::UserDefinedMeasurement>_*,_std::vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>_>
      ::operator++(&__end2);
    }
  }
  udms.
  super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ::~vector((vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
             *)local_38);
  if ((udms.
       super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> TestFixture::getUserDefinedMeasurementNames() const
{
	std::vector<std::string> names;
	const auto udms = this->getUserDefinedMeasurements();

	if(udms.empty() == false)
	{
		for(const auto& udm : udms)
		{
			names.emplace_back(udm->getName());
		}
	}

	return names;
}